

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O1

int Sfm_DecPeformDec3(Sfm_Dec_t *p,Abc_Obj_t *pObj)

{
  Vec_Int_t *vMap;
  Sfm_Par_t *pSVar1;
  void **ppvVar2;
  Mio_Gate_t *pGate;
  Mio_Gate_t *pGate_00;
  char *pFans1;
  char *pFans2;
  double dVar3;
  double dVar4;
  word wVar5;
  word wVar6;
  bool bVar7;
  int nVarsInit;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int (*pSupp_00) [16];
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  word *pwVar20;
  ulong uVar21;
  ulong uVar22;
  word wVar23;
  ulong uVar24;
  word (*pTruth) [4];
  bool bVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  int local_12b0;
  uint local_12ac;
  int local_12a0;
  Mio_Gate_t *local_1288;
  Mio_Gate_t *local_1280;
  char *local_1278;
  char *local_1270;
  timespec ts;
  Vec_Int_t vFanins;
  int nSupp [4];
  word Masks [2] [8];
  int pSupp [4] [16];
  word uTruth [4] [4];
  int pAssump [1000];
  
  pSVar1 = p->pPars;
  bVar25 = true;
  if (pSVar1->fPrintDecs == 0) {
    bVar25 = pSVar1->fVeryVerbose != 0;
  }
  if (pSVar1->fArea != 0) {
    __assert_fail("p->pPars->fArea == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                  ,0x4bf,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
  }
  uVar9 = pSVar1->nDecMax;
  p->DelayMin = 0;
  if (bVar25) {
    printf("\nNode %4d : MFFC %2d\n",(ulong)(uint)p->iTarget,(ulong)(uint)p->nMffc);
  }
  if (4 < p->pPars->nDecMax) {
    __assert_fail("p->pPars->nDecMax <= SFM_DEC_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                  ,0x4c5,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
  }
  Sfm_ObjSetupSimInfo(pObj);
  (p->vObjDec).nSize = 0;
  vMap = &p->vObjMap;
  uVar12 = 1;
  if (1 < (int)uVar9) {
    uVar12 = (ulong)uVar9;
  }
  local_12ac = 0xffffffff;
  uVar24 = 0;
  local_1270 = (char *)0x0;
  local_1278 = (char *)0x0;
  local_1280 = (Mio_Gate_t *)0x0;
  local_1288 = (Mio_Gate_t *)0x0;
  iVar17 = 0;
  do {
    if (p->pMit == (Sfm_Mit_t *)0x0) {
      local_12b0 = Sfm_TimReadObjDelay(p->pTim,pObj->Id);
    }
    else {
      local_12b0 = Sfm_MitReadObjDelay(p->pMit,pObj->Id);
    }
    if (iVar17 < (p->vObjDec).nSize) {
      (p->vObjDec).nSize = iVar17;
    }
    uVar9 = p->nPats[0];
    uVar13 = (ulong)uVar9;
    if (0x200 < uVar13) {
LAB_00526e09:
      __assert_fail("nBits >= 0 && nBits <= nWords * 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0xc6,"void Abc_TtMask(word *, int, int)");
    }
    pTruth = uTruth + uVar24;
    iVar17 = (p->vObjDec).nSize + 1;
    uVar19 = uVar13;
    pwVar20 = Masks[0];
    uVar22 = 0;
    do {
      uVar21 = uVar22 + 0x40;
      wVar23 = 0xffffffffffffffff;
      if (uVar13 < uVar21) {
        if (uVar22 < uVar13) {
          if (0x40 < uVar19) goto LAB_00526dea;
          wVar23 = 0xffffffffffffffff >> (0x40U - (char)uVar9 & 0x3f);
        }
        else {
          wVar23 = 0;
        }
      }
      *pwVar20 = wVar23;
      pwVar20 = pwVar20 + 1;
      uVar19 = uVar19 - 0x40;
      uVar22 = uVar21;
    } while (uVar21 != 0x200);
    uVar9 = p->nPats[1];
    uVar13 = (ulong)uVar9;
    if (0x200 < uVar13) goto LAB_00526e09;
    pwVar20 = Masks[1];
    uVar19 = uVar13;
    uVar22 = 0;
    do {
      uVar21 = uVar22 + 0x40;
      wVar23 = 0xffffffffffffffff;
      if (uVar13 < uVar21) {
        if (uVar22 < uVar13) {
          if (0x40 < uVar19) {
LAB_00526dea:
            __assert_fail("nBits >= 0 && nBits <= 64",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                          ,0xc2,"word Abc_Tt6Mask(int)");
          }
          wVar23 = 0xffffffffffffffff >> (0x40U - (char)uVar9 & 0x3f);
        }
        else {
          wVar23 = 0;
        }
      }
      *pwVar20 = wVar23;
      pwVar20 = pwVar20 + 1;
      uVar19 = uVar19 - 0x40;
      uVar22 = uVar21;
    } while (uVar21 != 0x200);
    pSupp_00 = pSupp + uVar24;
    nVarsInit = Sfm_DecPeformDec_rec(p,*pTruth,*pSupp_00,pAssump,0,Masks,1,0);
    nSupp[uVar24] = nVarsInit;
    if (nVarsInit == -2) {
LAB_00526800:
      if (bVar25) {
        printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n",uVar24 & 0xffffffff,
               (ulong)(uint)p->nPats[0],(ulong)(uint)p->nPats[1]);
      }
    }
    else {
      if (bVar25) {
        printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  Supp = %d  ",uVar24 & 0xffffffff,
               (ulong)(uint)p->nPats[0],(ulong)(uint)p->nPats[1]);
        Dau_DsdPrintFromTruth(*pTruth,nVarsInit);
      }
      if ((nVarsInit == 1 && p->pTim != (Sfm_Tim_t *)0x0) && ((*pTruth)[0] == 0x5555555555555555)) {
        iVar8 = (*pSupp_00)[0];
        if (((long)iVar8 < 0) || ((p->vObjMap).nSize <= iVar8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar10 = p->DelayInv;
        iVar8 = (p->vObjMap).pArray[iVar8];
        if (p->pMit == (Sfm_Mit_t *)0x0) {
          iVar8 = Sfm_TimReadObjDelay(p->pTim,iVar8);
        }
        else {
          iVar8 = Sfm_MitReadObjDelay(p->pMit,iVar8);
        }
        if (local_12b0 <= iVar8 + iVar10) goto LAB_00526800;
      }
      if (((nVarsInit == 1) && (p->pMit != (Sfm_Mit_t *)0x0)) &&
         ((*pTruth)[0] == 0x5555555555555555)) goto LAB_00526800;
      if (nVarsInit < 2) {
        p->nSuppVars = nVarsInit;
        wVar23 = (*pTruth)[0];
        wVar5 = uTruth[uVar24][1];
        wVar6 = uTruth[uVar24][3];
        p->Copy[2] = uTruth[uVar24][2];
        p->Copy[3] = wVar6;
        p->Copy[0] = wVar23;
        p->Copy[1] = wVar5;
        iVar17 = Sfm_LibImplementSimple
                           (p->pLib,*pTruth,*pSupp_00,nVarsInit,&p->vObjGates,&p->vObjFanins);
        if (p->pPars->nVarMax < nVarsInit) {
          __assert_fail("nSupp[i] <= p->pPars->nVarMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                        ,0x4ef,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckySizes[nVarsInit] = p->nLuckySizes[nVarsInit] + 1;
        if (iVar17 < 3) {
          p->nLuckyGates[iVar17] = p->nLuckyGates[iVar17] + 1;
          return iVar17;
        }
        __assert_fail("RetValue <= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                      ,0x4f1,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
      }
      Sfm_DecPrepareVec(vMap,*pSupp_00,nVarsInit,&p->vGateCut);
      iVar8 = Sfm_DecMffcAreaReal(pObj,&p->vGateCut,&p->vGateMffc);
      p->nSuppVars = nVarsInit;
      wVar23 = uTruth[uVar24][1];
      wVar5 = uTruth[uVar24][2];
      wVar6 = uTruth[uVar24][3];
      p->Copy[0] = (*pTruth)[0];
      p->Copy[1] = wVar23;
      p->Copy[2] = wVar5;
      p->Copy[3] = wVar6;
      uVar9 = Sfm_LibFindDelayMatches
                        (p->pLib,*pTruth,*pSupp_00,nVarsInit,&p->vMatchGates,&p->vMatchFans);
      if (0 < (int)uVar9) {
        lVar16 = 0;
        local_12a0 = 0;
        do {
          iVar10 = clock_gettime(3,(timespec *)&ts);
          if (iVar10 < 0) {
            lVar14 = 1;
          }
          else {
            lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
            lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + ts.tv_sec * -1000000;
          }
          iVar10 = (p->vMatchGates).nSize;
          iVar18 = (int)lVar16;
          if ((iVar10 <= iVar18) || (iVar10 <= iVar18 + 1)) {
LAB_00526dcb:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          ppvVar2 = (p->vMatchGates).pArray;
          pGate = (Mio_Gate_t *)ppvVar2[lVar16];
          pGate_00 = (Mio_Gate_t *)ppvVar2[lVar16 + 1];
          dVar3 = Mio_GateReadArea(pGate);
          if (pGate_00 == (Mio_Gate_t *)0x0) {
            uVar26 = 0;
            uVar27 = 0;
          }
          else {
            dVar4 = Mio_GateReadArea(pGate_00);
            uVar26 = SUB84(dVar4,0);
            uVar27 = (undefined4)((ulong)dVar4 >> 0x20);
          }
          iVar10 = (p->vMatchFans).nSize;
          if ((iVar10 <= iVar18) || (iVar10 <= iVar18 + 1)) goto LAB_00526dcb;
          iVar10 = (int)((float)(dVar3 + (double)CONCAT44(uVar27,uVar26)) * 1000.0);
          ppvVar2 = (p->vMatchFans).pArray;
          pFans1 = (char *)ppvVar2[lVar16];
          pFans2 = (char *)ppvVar2[lVar16 + 1];
          vFanins.nCap = nVarsInit;
          vFanins.nSize = nVarsInit;
          vFanins.pArray = *pSupp_00;
          if (p->pMit == (Sfm_Mit_t *)0x0) {
            iVar11 = Sfm_TimEvalRemapping(p->pTim,&vFanins,vMap,pGate,pFans1,pGate_00,pFans2);
            iVar18 = p->pPars->DelAreaRatio;
            if (((iVar18 != 0) && (iVar10 - iVar8 != 0 && iVar8 <= iVar10)) &&
               (iVar11 / (iVar10 - iVar8) < iVar18)) goto LAB_00526b94;
            bVar7 = true;
            if (iVar11 < local_12b0) {
              local_12b0 = iVar11;
              local_12ac = (uint)uVar24;
              local_1288 = pGate;
              local_1280 = pGate_00;
              local_1278 = pFans1;
              local_1270 = pFans2;
            }
          }
          else {
            iVar11 = Sfm_MitEvalRemapping
                               (p->pMit,&p->vGateMffc,pObj,&vFanins,vMap,pGate,pFans1,pGate_00,
                                pFans2);
            iVar18 = p->pPars->DelAreaRatio;
            if (((iVar18 == 0) || (iVar10 - iVar8 == 0 || iVar10 < iVar8)) ||
               (iVar18 <= iVar11 / (iVar10 - iVar8))) {
              bVar7 = true;
              if (local_12a0 < iVar11) {
                local_12ac = (uint)uVar24;
                local_12a0 = iVar11;
                local_1288 = pGate;
                local_1280 = pGate_00;
                local_1278 = pFans1;
                local_1270 = pFans2;
              }
            }
            else {
LAB_00526b94:
              bVar7 = false;
            }
          }
          if (bVar7) {
            iVar10 = clock_gettime(3,(timespec *)&ts);
            if (iVar10 < 0) {
              lVar15 = -1;
            }
            else {
              lVar15 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            p->timeEval = p->timeEval + lVar15 + lVar14;
          }
          lVar16 = lVar16 + 2;
        } while ((ulong)uVar9 * 2 != lVar16);
      }
    }
    uVar24 = uVar24 + 1;
    if (uVar24 == uVar12) {
      Sfm_ObjSetdownSimInfo(pObj);
      if (local_12ac == 0xffffffff) {
        if (bVar25) {
          puts("Best  : NO DEC.");
        }
        p->nNoDecs = p->nNoDecs + 1;
        iVar17 = -2;
      }
      else {
        lVar16 = (long)(int)local_12ac;
        if (bVar25) {
          printf("Best %d: %d  ",(ulong)local_12ac,(ulong)(uint)nSupp[lVar16]);
        }
        iVar17 = Sfm_LibImplementGatesDelay
                           (p->pLib,pSupp[lVar16],local_1288,local_1280,local_1278,local_1270,
                            &p->vObjGates,&p->vObjFanins);
        if (p->pPars->nVarMax < nSupp[lVar16]) {
          __assert_fail("nSupp[iBest] <= p->pPars->nVarMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                        ,0x539,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckySizes[nSupp[lVar16]] = p->nLuckySizes[nSupp[lVar16]] + 1;
        if (2 < iVar17) {
          __assert_fail("RetValue <= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                        ,0x53b,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckyGates[iVar17] = p->nLuckyGates[iVar17] + 1;
        p->DelayMin = local_12b0;
        iVar17 = 1;
      }
      return iVar17;
    }
  } while( true );
}

Assistant:

int Sfm_DecPeformDec3( Sfm_Dec_t * p, Abc_Obj_t * pObj )
{
    word uTruth[SFM_DEC_MAX][SFM_WORD_MAX], Masks[2][SFM_SIM_WORDS];
    int pSupp[SFM_DEC_MAX][2*SFM_SUPP_MAX];
    int nSupp[SFM_DEC_MAX], pAssump[SFM_WIN_MAX];
    int fVeryVerbose = p->pPars->fPrintDecs || p->pPars->fVeryVerbose;
    int nDecs = Abc_MaxInt(p->pPars->nDecMax, 1);
    int i, k, DelayOrig = 0, DelayMin, GainMax, AreaMffc, nMatches, iBest = -1, RetValue, Prev = 0; 
    Mio_Gate_t * pGate1Best = NULL, * pGate2Best = NULL; 
    char * pFans1Best = NULL, * pFans2Best = NULL;
    assert( p->pPars->fArea == 0 );
    p->DelayMin = 0;
    //Sfm_DecPrint( p, NULL );
    if ( fVeryVerbose )
        printf( "\nNode %4d : MFFC %2d\n", p->iTarget, p->nMffc );
    // set limit on search for decompositions in delay-model
    assert( p->pPars->nDecMax <= SFM_DEC_MAX );
    Sfm_ObjSetupSimInfo( pObj );
    Vec_IntClear( &p->vObjDec );
    for ( i = 0; i < nDecs; i++ )
    {
        GainMax = 0;
        DelayMin = DelayOrig = Sfm_ManReadObjDelay( p, Abc_ObjId(pObj) );
        // reduce the variable array
        if ( Vec_IntSize(&p->vObjDec) > Prev )
            Vec_IntShrink( &p->vObjDec, Prev );
        Prev = Vec_IntSize(&p->vObjDec) + 1;
        // perform decomposition 
        Abc_TtMask( Masks[0], SFM_SIM_WORDS, p->nPats[0] );
        Abc_TtMask( Masks[1], SFM_SIM_WORDS, p->nPats[1] );        
        nSupp[i] = Sfm_DecPeformDec_rec( p, uTruth[i], pSupp[i], pAssump, 0, Masks, 1, 0 );
        if ( nSupp[i] == -2 )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( fVeryVerbose )
            printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  Supp = %d  ", i, p->nPats[0], p->nPats[1], nSupp[i] );
        if ( fVeryVerbose )
            Dau_DsdPrintFromTruth( uTruth[i], nSupp[i] );
        if ( p->pTim && nSupp[i] == 1 && uTruth[i][0] == ABC_CONST(0x5555555555555555) && DelayMin <= p->DelayInv + Sfm_ManReadObjDelay(p, Vec_IntEntry(&p->vObjMap, pSupp[i][0])) )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( p->pMit && nSupp[i] == 1 && uTruth[i][0] == ABC_CONST(0x5555555555555555) )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( nSupp[i] < 2 )
        {
            p->nSuppVars = nSupp[i];
            Abc_TtCopy( p->Copy, uTruth[i], SFM_WORD_MAX, 0 ); 
            RetValue = Sfm_LibImplementSimple( p->pLib, uTruth[i], pSupp[i], nSupp[i], &p->vObjGates, &p->vObjFanins );
            assert( nSupp[i] <= p->pPars->nVarMax );
            p->nLuckySizes[nSupp[i]]++;
            assert( RetValue <= 2 );
            p->nLuckyGates[RetValue]++;
            return RetValue;
        }

        // get MFFC
        Sfm_DecPrepareVec( &p->vObjMap, pSupp[i], nSupp[i], &p->vGateCut ); // returns cut in p->vGateCut
        AreaMffc = Sfm_DecMffcAreaReal(pObj, &p->vGateCut, &p->vGateMffc ); // returns MFFC in p->vGateMffc

        // try the delay
        p->nSuppVars = nSupp[i];
        Abc_TtCopy( p->Copy, uTruth[i], SFM_WORD_MAX, 0 ); 
        nMatches = Sfm_LibFindDelayMatches( p->pLib, uTruth[i], pSupp[i], nSupp[i], &p->vMatchGates, &p->vMatchFans );
        for ( k = 0; k < nMatches; k++ )
        {
            abctime clk = Abc_Clock();
            Mio_Gate_t * pGate1 = (Mio_Gate_t *)Vec_PtrEntry( &p->vMatchGates, 2*k+0 );
            Mio_Gate_t * pGate2 = (Mio_Gate_t *)Vec_PtrEntry( &p->vMatchGates, 2*k+1 );
            int AreaNew = Scl_Flt2Int( Mio_GateReadArea(pGate1) + (pGate2 ? Mio_GateReadArea(pGate2) : 0.0) );
            char * pFans1 = (char *)Vec_PtrEntry( &p->vMatchFans, 2*k+0 );
            char * pFans2 = (char *)Vec_PtrEntry( &p->vMatchFans, 2*k+1 );
            Vec_Int_t vFanins = { nSupp[i], nSupp[i], pSupp[i] };
            // skip identical gate
            //if ( pGate2 == NULL && pGate1 == (Mio_Gate_t *)pObj->pData )
            //    continue;
            if ( p->pMit )
            {
                int Gain = Sfm_MitEvalRemapping( p->pMit, &p->vGateMffc, pObj, &vFanins, &p->vObjMap, pGate1, pFans1, pGate2, pFans2 );
                if ( p->pPars->DelAreaRatio && AreaNew > AreaMffc && (Gain / (AreaNew - AreaMffc)) < p->pPars->DelAreaRatio )
                    continue;
                if ( GainMax < Gain )
                {
                    GainMax    = Gain;
                    pGate1Best = pGate1;
                    pGate2Best = pGate2;
                    pFans1Best = pFans1;
                    pFans2Best = pFans2;
                    iBest      = i;
                }
            }
            else
            {
                int Delay = Sfm_TimEvalRemapping( p->pTim, &vFanins, &p->vObjMap, pGate1, pFans1, pGate2, pFans2 );
                if ( p->pPars->DelAreaRatio && AreaNew > AreaMffc && (Delay / (AreaNew - AreaMffc)) < p->pPars->DelAreaRatio )
                    continue;
                if ( DelayMin > Delay )
                {
                    DelayMin   = Delay;
                    pGate1Best = pGate1;
                    pGate2Best = pGate2;
                    pFans1Best = pFans1;
                    pFans2Best = pFans2;
                    iBest      = i;
                }
            }
            p->timeEval += Abc_Clock() - clk;
        }
    }
//printf( "Gain max = %d.\n", GainMax );
    Sfm_ObjSetdownSimInfo( pObj );
    if ( iBest == -1 )
    {
        if ( fVeryVerbose )
            printf( "Best  : NO DEC.\n" );
        p->nNoDecs++;
        return -2;
    }
    if ( fVeryVerbose )
        printf( "Best %d: %d  ", iBest, nSupp[iBest] );
//    if ( fVeryVerbose )
//        Dau_DsdPrintFromTruth( uTruth[iBest], nSupp[iBest] );
    RetValue = Sfm_LibImplementGatesDelay( p->pLib, pSupp[iBest], pGate1Best, pGate2Best, pFans1Best, pFans2Best, &p->vObjGates, &p->vObjFanins );
    assert( nSupp[iBest] <= p->pPars->nVarMax );
    p->nLuckySizes[nSupp[iBest]]++;
    assert( RetValue <= 2 );
    p->nLuckyGates[RetValue]++;
    p->DelayMin = DelayMin;
    return 1;
}